

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O3

void __thiscall FTraceInfo::Setup3DFloors(FTraceInfo *this)

{
  extsector_t *peVar1;
  F3DFloor **ppFVar2;
  F3DFloor *pFVar3;
  secplane_t *psVar4;
  FTraceResults *pFVar5;
  sector_t *psVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  peVar1 = this->CurSector->e;
  if ((peVar1->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
    memcpy(this->DummySector,this->CurSector,0x268);
    this->CurSector = this->DummySector;
    this->sectorsel = 1;
    uVar11 = (ulong)(peVar1->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    if (uVar11 != 0) {
      dVar14 = this->MaxDist * this->startfrac;
      dVar15 = dVar14 * (this->Vec).X + (this->Start).X;
      dVar16 = dVar14 * (this->Vec).Y + (this->Start).Y;
      dVar17 = (this->Vec).Z * dVar14 + (this->Start).Z;
      ppFVar2 = (peVar1->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
      dVar14 = this->DummySector[0].ceilingplane.negiC *
               (this->DummySector[0].ceilingplane.normal.Y * dVar16 +
               this->DummySector[0].ceilingplane.D +
               this->DummySector[0].ceilingplane.normal.X * dVar15);
      dVar18 = this->DummySector[0].floorplane.negiC *
               (this->DummySector[0].floorplane.normal.Y * dVar16 +
               this->DummySector[0].floorplane.D + this->DummySector[0].floorplane.normal.X * dVar15
               );
      lVar10 = 0;
      do {
        pFVar3 = *(F3DFloor **)((long)ppFVar2 + lVar10);
        if ((pFVar3->flags & 1) != 0) {
          if ((((pFVar3->flags & 0x10) != 0) && (this->Results->Crossed3DWater == (F3DFloor *)0x0))
             && (bVar9 = CheckPlane(this,(pFVar3->top).plane), bVar9)) {
            psVar4 = (pFVar3->top).plane;
            pFVar5 = this->Results;
            dVar7 = (pFVar5->HitPos).X;
            dVar8 = (pFVar5->HitPos).Y;
            if (dVar18 < ((psVar4->normal).Y * dVar8 + psVar4->D + (psVar4->normal).X * dVar7) *
                         psVar4->negiC) {
              pFVar5->Crossed3DWater = pFVar3;
              (pFVar5->Crossed3DWaterPos).Z = (pFVar5->HitPos).Z;
              (pFVar5->Crossed3DWaterPos).X = dVar7;
              (pFVar5->Crossed3DWaterPos).Y = dVar8;
              pFVar5->Distance = 0.0;
            }
          }
          if ((pFVar3->flags & 0x4000000) == 0) {
            psVar4 = (pFVar3->top).plane;
            dVar7 = (psVar4->normal).X;
            dVar8 = (psVar4->normal).Y;
            dVar12 = (dVar16 * dVar8 + psVar4->D + dVar15 * dVar7) * psVar4->negiC;
            if (dVar17 <= dVar12) {
              psVar4 = (pFVar3->bottom).plane;
              dVar7 = (psVar4->normal).X;
              dVar8 = (psVar4->normal).Y;
              dVar13 = (dVar16 * dVar8 + psVar4->D + dVar15 * dVar7) * psVar4->negiC;
              if (dVar13 <= dVar17) {
                if (dVar18 < dVar13) {
                  psVar6 = this->CurSector;
                  (psVar6->floorplane).normal.Z = (psVar4->normal).Z;
                  (psVar6->floorplane).normal.X = dVar7;
                  (psVar6->floorplane).normal.Y = dVar8;
                  dVar18 = psVar4->negiC;
                  (psVar6->floorplane).D = psVar4->D;
                  (psVar6->floorplane).negiC = dVar18;
                  psVar6 = this->CurSector;
                  psVar6->planes[0].Texture.texnum = ((pFVar3->bottom).texture)->texnum;
                  psVar6->Portals[0] = 0;
                  psVar6->portals[0] = (FPortal *)0x0;
                  dVar18 = dVar13;
                }
                if (dVar12 < dVar14) {
                  psVar4 = (pFVar3->top).plane;
                  psVar6 = this->CurSector;
                  (psVar6->ceilingplane).normal.Z = (psVar4->normal).Z;
                  dVar14 = (psVar4->normal).Y;
                  (psVar6->ceilingplane).normal.X = (psVar4->normal).X;
                  (psVar6->ceilingplane).normal.Y = dVar14;
                  dVar14 = psVar4->negiC;
                  (psVar6->ceilingplane).D = psVar4->D;
                  (psVar6->ceilingplane).negiC = dVar14;
                  psVar6 = this->CurSector;
                  psVar6->planes[1].Texture.texnum = ((pFVar3->top).texture)->texnum;
                  psVar6->Portals[1] = 0;
                  psVar6->portals[1] = (FPortal *)0x0;
                  dVar14 = dVar12;
                }
                this->inshootthrough = 0;
              }
              else if (dVar13 < dVar14) {
                psVar6 = this->CurSector;
                (psVar6->ceilingplane).normal.Z = (psVar4->normal).Z;
                (psVar6->ceilingplane).normal.X = dVar7;
                (psVar6->ceilingplane).normal.Y = dVar8;
                dVar14 = psVar4->negiC;
                (psVar6->ceilingplane).D = psVar4->D;
                (psVar6->ceilingplane).negiC = dVar14;
                psVar6 = this->CurSector;
                psVar6->planes[1].Texture.texnum = ((pFVar3->bottom).texture)->texnum;
                psVar6->Portals[1] = 0;
                psVar6->portals[1] = (FPortal *)0x0;
                dVar14 = dVar13;
              }
            }
            else if (dVar18 < dVar12) {
              psVar6 = this->CurSector;
              (psVar6->floorplane).normal.Z = (psVar4->normal).Z;
              (psVar6->floorplane).normal.X = dVar7;
              (psVar6->floorplane).normal.Y = dVar8;
              dVar18 = psVar4->negiC;
              (psVar6->floorplane).D = psVar4->D;
              (psVar6->floorplane).negiC = dVar18;
              psVar6 = this->CurSector;
              psVar6->planes[0].Texture.texnum = ((pFVar3->top).texture)->texnum;
              psVar6->Portals[0] = 0;
              psVar6->portals[0] = (FPortal *)0x0;
              dVar18 = dVar12;
            }
          }
        }
        lVar10 = lVar10 + 8;
      } while (uVar11 << 3 != lVar10);
    }
  }
  return;
}

Assistant:

void FTraceInfo::Setup3DFloors()
{
	TDeletingArray<F3DFloor*> &ff = CurSector->e->XFloor.ffloors;

	if (ff.Size())
	{
		memcpy(&DummySector[0], CurSector, sizeof(sector_t));
		CurSector = &DummySector[0];
		sectorsel = 1;

		double sdist = MaxDist * startfrac;
		DVector3 pos = Start + Vec * sdist;


		double bf = CurSector->floorplane.ZatPoint(pos);
		double bc = CurSector->ceilingplane.ZatPoint(pos);

		for (auto rover : ff)
		{
			if (!(rover->flags&FF_EXISTS))
				continue;

			if (rover->flags&FF_SWIMMABLE && Results->Crossed3DWater == NULL)
			{
				if (Check3DFloorPlane(rover, false))
				{
					// only consider if the plane is above the actual floor.
					if (rover->top.plane->ZatPoint(Results->HitPos) > bf)
					{
						Results->Crossed3DWater = rover;
						Results->Crossed3DWaterPos = Results->HitPos;
						Results->Distance = 0;
					}
				}
			}

			if (!(rover->flags&FF_SHOOTTHROUGH))
			{
				double ff_bottom = rover->bottom.plane->ZatPoint(pos);
				double ff_top = rover->top.plane->ZatPoint(pos);
				// clip to the part of the sector we are in
				if (pos.Z > ff_top)
				{
					// above
					if (bf < ff_top)
					{
						CurSector->floorplane = *rover->top.plane;
						CurSector->SetTexture(sector_t::floor, *rover->top.texture, false);
						CurSector->ClearPortal(sector_t::floor);
						bf = ff_top;
					}
				}
				else if (pos.Z < ff_bottom)
				{
					//below
					if (bc > ff_bottom)
					{
						CurSector->ceilingplane = *rover->bottom.plane;
						CurSector->SetTexture(sector_t::ceiling, *rover->bottom.texture, false);
						bc = ff_bottom;
						CurSector->ClearPortal(sector_t::ceiling);
					}
				}
				else
				{
					// inside
					if (bf < ff_bottom)
					{
						CurSector->floorplane = *rover->bottom.plane;
						CurSector->SetTexture(sector_t::floor, *rover->bottom.texture, false);
						CurSector->ClearPortal(sector_t::floor);
						bf = ff_bottom;
					}

					if (bc > ff_top)
					{
						CurSector->ceilingplane = *rover->top.plane;
						CurSector->SetTexture(sector_t::ceiling, *rover->top.texture, false);
						CurSector->ClearPortal(sector_t::ceiling);
						bc = ff_top;
					}
					inshootthrough = false;
				}
			}
		}
	}
}